

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void prvTidyDropAttrByName(TidyDocImpl *doc,Node *node,ctmbstr name)

{
  AttVal *pAVar1;
  int iVar2;
  AttVal *pAVar3;
  AttVal *av;
  AttVal *pAVar4;
  
  pAVar4 = (AttVal *)0x0;
  pAVar1 = node->attributes;
  do {
    do {
      av = pAVar1;
      pAVar3 = pAVar4;
      if (av == (AttVal *)0x0) {
        return;
      }
      pAVar1 = av->next;
      pAVar4 = av;
    } while (av->attribute == (ctmbstr)0x0);
    iVar2 = prvTidytmbstrcmp(av->attribute,name);
  } while (iVar2 != 0);
  pAVar4 = (AttVal *)&node->attributes;
  if (pAVar3 != (AttVal *)0x0) {
    pAVar4 = pAVar3;
  }
  pAVar4->next = pAVar1;
  prvTidyFreeAttribute(doc,av);
  return;
}

Assistant:

void TY_(DropAttrByName)( TidyDocImpl* doc, Node *node, ctmbstr name )
{
    AttVal *attr, *prev = NULL, *next;

    for (attr = node->attributes; attr != NULL; prev = attr, attr = next)
    {
        next = attr->next;

        if (attr->attribute && TY_(tmbstrcmp)(attr->attribute, name) == 0)
        {
            if (prev)
                 prev->next = next;
            else
                 node->attributes = next;

            TY_(FreeAttribute)( doc, attr ); 
            break;
        }
    }
}